

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

FSerializer *
Serialize<line_t*,line_t*>
          (FSerializer *arc,char *key,TArray<line_t_*,_line_t_*> *value,
          TArray<line_t_*,_line_t_*> *param_4)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  line_t_conflict **value_00;
  uint local_38;
  uint i;
  bool res;
  TArray<line_t_*,_line_t_*> *param_3_local;
  TArray<line_t_*,_line_t_*> *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if ((!bVar1) || (uVar3 = TArray<line_t_*,_line_t_*>::Size(value), uVar3 != 0)) {
    bVar1 = FSerializer::BeginArray(arc,key);
    bVar2 = FSerializer::isReading(arc);
    if (bVar2) {
      if (!bVar1) {
        TArray<line_t_*,_line_t_*>::Clear(value);
        return arc;
      }
      uVar3 = FSerializer::ArraySize(arc);
      TArray<line_t_*,_line_t_*>::Resize(value,uVar3);
    }
    for (local_38 = 0; uVar3 = TArray<line_t_*,_line_t_*>::Size(value), local_38 < uVar3;
        local_38 = local_38 + 1) {
      value_00 = TArray<line_t_*,_line_t_*>::operator[](value,(ulong)local_38);
      Serialize<line_t>(arc,(char *)0x0,value_00,(line_t_conflict **)0x0);
    }
    FSerializer::EndArray(arc);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, TArray<T, TT> &value, TArray<T, TT> *)
{
	if (arc.isWriting())
	{
		if (value.Size() == 0) return arc;	// do not save empty arrays
	}
	bool res = arc.BeginArray(key);
	if (arc.isReading())
	{
		if (!res)
		{
			value.Clear();
			return arc;
		}
		value.Resize(arc.ArraySize());
	}
	for (unsigned i = 0; i < value.Size(); i++)
	{
		Serialize(arc, nullptr, value[i], (T*)nullptr);
	}
	arc.EndArray();
	return arc;
}